

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_getglobal(lua_State *L,char *name)

{
  TValue *t;
  long lVar1;
  StkId pSVar2;
  TString *key;
  TValue *slot;
  TValue *io;
  TString *x_;
  bool bVar3;
  
  lVar1 = *(long *)((L->l_G->l_registry).value_.f + 0x10);
  t = (TValue *)(lVar1 + 0x10);
  key = luaS_new(L,name);
  if (*(char *)(lVar1 + 0x18) == 'E') {
    slot = luaH_getstr((Table *)(t->value_).gc,key);
    bVar3 = (slot->tt_ & 0xf) == 0;
  }
  else {
    bVar3 = true;
    slot = (TValue *)0x0;
  }
  pSVar2 = (L->top).p;
  if (bVar3) {
    *(TString **)pSVar2 = key;
    (pSVar2->val).tt_ = key->tt | 0x40;
    pSVar2 = (L->top).p;
    (L->top).p = pSVar2 + 1;
    luaV_finishget(L,t,&pSVar2->val,pSVar2,slot);
  }
  else {
    (pSVar2->val).value_ = slot->value_;
    (pSVar2->val).tt_ = slot->tt_;
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  return *(byte *)((L->top).offset + -8) & 0xf;
}

Assistant:

LUA_API int lua_getglobal (lua_State *L, const char *name) {
  const TValue *G;
  lua_lock(L);
  G = getGtable(L);
  return auxgetstr(L, G, name);
}